

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O1

EC_KEY * d2i_EC_PUBKEY(EC_KEY **a,uchar **pp,long length)

{
  EVP_PKEY *pkey;
  ec_key_st *peVar1;
  CBS cbs;
  CBS local_30;
  
  if (length < 0) {
    peVar1 = (ec_key_st *)0x0;
  }
  else {
    local_30.data = *pp;
    local_30.len = length;
    pkey = (EVP_PKEY *)EVP_parse_public_key(&local_30);
    if (pkey == (EVP_PKEY *)0x0) {
      peVar1 = (ec_key_st *)0x0;
    }
    else {
      peVar1 = EVP_PKEY_get1_EC_KEY(pkey);
      if (peVar1 == (ec_key_st *)0x0) {
        peVar1 = (ec_key_st *)0x0;
      }
      else {
        if (a != (EC_KEY **)0x0) {
          EC_KEY_free(*a);
          *a = peVar1;
        }
        *pp = local_30.data;
      }
    }
    if (pkey != (EVP_PKEY *)0x0) {
      EVP_PKEY_free(pkey);
    }
  }
  return peVar1;
}

Assistant:

EC_KEY *d2i_EC_PUBKEY(EC_KEY **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return nullptr;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  bssl::UniquePtr<EVP_PKEY> pkey(EVP_parse_public_key(&cbs));
  if (pkey == nullptr) {
    return nullptr;
  }
  bssl::UniquePtr<EC_KEY> ec_key(EVP_PKEY_get1_EC_KEY(pkey.get()));
  if (ec_key == nullptr) {
    return nullptr;
  }
  if (out != nullptr) {
    EC_KEY_free(*out);
    *out = ec_key.get();
  }
  *inp = CBS_data(&cbs);
  return ec_key.release();
}